

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

int64_t __thiscall serial::MillisecondTimer::remaining(MillisecondTimer *this)

{
  timespec time;
  timespec local_20;
  
  clock_gettime(1,&local_20);
  return (long)((double)(long)((double)((this->expiry).tv_sec - local_20.tv_sec) * 1000.0) +
               (double)((this->expiry).tv_nsec - local_20.tv_nsec) / 1000000.0);
}

Assistant:

int64_t
MillisecondTimer::remaining ()
{
  timespec now(timespec_now());
  int64_t millis = (expiry.tv_sec - now.tv_sec) * 1e3;
  millis += (expiry.tv_nsec - now.tv_nsec) / 1e6;
  return millis;
}